

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

Image * GenImageColor(Image *__return_storage_ptr__,int width,int height,Color color)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  
  uVar5 = height * width;
  pvVar2 = calloc((long)(int)uVar5,4);
  auVar1 = _DAT_0015d7b0;
  if (0 < (int)uVar5) {
    lVar3 = (ulong)uVar5 - 1;
    auVar6._8_4_ = (int)lVar3;
    auVar6._0_8_ = lVar3;
    auVar6._12_4_ = (int)((ulong)lVar3 >> 0x20);
    uVar4 = 0;
    auVar6 = auVar6 ^ _DAT_0015d7b0;
    auVar8 = _DAT_00164b50;
    auVar9 = _DAT_00163250;
    do {
      auVar10 = auVar9 ^ auVar1;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar7 && auVar6._0_4_ < auVar10._0_4_ || iVar7 < auVar10._4_4_)
                & 1)) {
        *(Color *)((long)pvVar2 + uVar4 * 4) = color;
      }
      if ((auVar10._12_4_ != auVar6._12_4_ || auVar10._8_4_ <= auVar6._8_4_) &&
          auVar10._12_4_ <= auVar6._12_4_) {
        *(Color *)((long)pvVar2 + uVar4 * 4 + 4) = color;
      }
      auVar10 = auVar8 ^ auVar1;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar7 && (iVar11 != iVar7 || auVar10._0_4_ <= auVar6._0_4_)) {
        *(Color *)((long)pvVar2 + uVar4 * 4 + 8) = color;
        *(Color *)((long)pvVar2 + uVar4 * 4 + 0xc) = color;
      }
      uVar4 = uVar4 + 4;
      lVar3 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar3 + 4;
      lVar3 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar3 + 4;
    } while ((uVar5 + 3 & 0xfffffffc) != uVar4);
  }
  __return_storage_ptr__->data = pvVar2;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageColor(int width, int height, Color color)
{
    Color *pixels = (Color *)RL_CALLOC(width*height, sizeof(Color));

    for (int i = 0; i < width*height; i++) pixels[i] = color;

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}